

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O1

char * ngx_http_log_open_file_cache(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long *plVar1;
  u_char *puVar2;
  int iVar3;
  ngx_uint_t max;
  ngx_uint_t nVar4;
  ngx_open_file_cache_t *pnVar5;
  char *pcVar6;
  ngx_http_log_loc_conf_t *llcf;
  long *plVar7;
  ulong uVar8;
  undefined1 local_60 [8];
  ngx_str_t s;
  ngx_uint_t local_48;
  ngx_uint_t local_40;
  ngx_uint_t local_38;
  
  if (*(long *)((long)conf + 8) != -1) {
    return "is duplicate";
  }
  s.data = (u_char *)conf;
  if (cf->args->nelts < 2) {
    local_40 = 1;
    local_38 = 0x3c;
    local_48 = 10;
    max = 0;
  }
  else {
    local_48 = 10;
    local_38 = 0x3c;
    uVar8 = 1;
    max = 0;
    local_40 = 1;
    plVar1 = (long *)cf->args->elts;
    do {
      plVar7 = plVar1 + 2;
      pcVar6 = (char *)plVar1[3];
      iVar3 = strncmp(pcVar6,"max=",4);
      if (iVar3 == 0) {
        max = ngx_atoi((u_char *)(pcVar6 + 4),*plVar7 - 4);
        nVar4 = max;
joined_r0x00147e6d:
        if (nVar4 == 0xffffffffffffffff) {
LAB_00147f58:
          ngx_conf_log_error(1,cf,0,"invalid \"open_log_file_cache\" parameter \"%V\"",plVar7);
          goto LAB_00147f8d;
        }
      }
      else {
        iVar3 = strncmp(pcVar6,"inactive=",9);
        if (iVar3 == 0) {
          local_60 = (undefined1  [8])(*plVar7 - 9);
          s.len = (size_t)(pcVar6 + 9);
          local_48 = ngx_parse_time((ngx_str_t *)local_60,1);
          nVar4 = local_48;
          goto joined_r0x00147e6d;
        }
        iVar3 = strncmp(pcVar6,"min_uses=",9);
        if (iVar3 == 0) {
          local_40 = ngx_atoi((u_char *)(pcVar6 + 9),*plVar7 - 9);
          nVar4 = local_40;
          goto joined_r0x00147e6d;
        }
        iVar3 = strncmp(pcVar6,"valid=",6);
        if (iVar3 == 0) {
          local_60 = (undefined1  [8])(*plVar7 - 6);
          s.len = (size_t)(pcVar6 + 6);
          local_38 = ngx_parse_time((ngx_str_t *)local_60,1);
          nVar4 = local_38;
          goto joined_r0x00147e6d;
        }
        iVar3 = strcmp(pcVar6,"off");
        if (iVar3 != 0) goto LAB_00147f58;
        s.data[8] = '\0';
        s.data[9] = '\0';
        s.data[10] = '\0';
        s.data[0xb] = '\0';
        s.data[0xc] = '\0';
        s.data[0xd] = '\0';
        s.data[0xe] = '\0';
        s.data[0xf] = '\0';
      }
      uVar8 = uVar8 + 1;
      plVar1 = plVar7;
    } while (uVar8 < cf->args->nelts);
  }
  puVar2 = s.data;
  if (*(long *)(s.data + 8) == 0) {
LAB_00147f54:
    pcVar6 = (char *)0x0;
  }
  else {
    if (max == 0) {
      ngx_conf_log_error(1,cf,0,"\"open_log_file_cache\" must have \"max\" parameter");
    }
    else {
      pnVar5 = ngx_open_file_cache_init(cf->pool,max,local_48);
      *(ngx_open_file_cache_t **)(puVar2 + 8) = pnVar5;
      if (pnVar5 != (ngx_open_file_cache_t *)0x0) {
        *(ngx_uint_t *)(puVar2 + 0x10) = local_38;
        *(ngx_uint_t *)(puVar2 + 0x18) = local_40;
        goto LAB_00147f54;
      }
    }
LAB_00147f8d:
    pcVar6 = (char *)0xffffffffffffffff;
  }
  return pcVar6;
}

Assistant:

static char *
ngx_http_log_open_file_cache(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_log_loc_conf_t *llcf = conf;

    time_t       inactive, valid;
    ngx_str_t   *value, s;
    ngx_int_t    max, min_uses;
    ngx_uint_t   i;

    if (llcf->open_file_cache != NGX_CONF_UNSET_PTR) {
        return "is duplicate";
    }

    value = cf->args->elts;

    max = 0;
    inactive = 10;
    valid = 60;
    min_uses = 1;

    for (i = 1; i < cf->args->nelts; i++) {

        if (ngx_strncmp(value[i].data, "max=", 4) == 0) {

            max = ngx_atoi(value[i].data + 4, value[i].len - 4);
            if (max == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "inactive=", 9) == 0) {

            s.len = value[i].len - 9;
            s.data = value[i].data + 9;

            inactive = ngx_parse_time(&s, 1);
            if (inactive == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "min_uses=", 9) == 0) {

            min_uses = ngx_atoi(value[i].data + 9, value[i].len - 9);
            if (min_uses == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "valid=", 6) == 0) {

            s.len = value[i].len - 6;
            s.data = value[i].data + 6;

            valid = ngx_parse_time(&s, 1);
            if (valid == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strcmp(value[i].data, "off") == 0) {

            llcf->open_file_cache = NULL;

            continue;
        }

    failed:

        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid \"open_log_file_cache\" parameter \"%V\"",
                           &value[i]);
        return NGX_CONF_ERROR;
    }

    if (llcf->open_file_cache == NULL) {
        return NGX_CONF_OK;
    }

    if (max == 0) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                        "\"open_log_file_cache\" must have \"max\" parameter");
        return NGX_CONF_ERROR;
    }

    llcf->open_file_cache = ngx_open_file_cache_init(cf->pool, max, inactive);

    if (llcf->open_file_cache) {

        llcf->open_file_cache_valid = valid;
        llcf->open_file_cache_min_uses = min_uses;

        return NGX_CONF_OK;
    }

    return NGX_CONF_ERROR;
}